

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-multicast-join.c
# Opt level: O3

int run_test_udp_multicast_join(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  uv_udp_send_t *puVar2;
  undefined8 uVar3;
  undefined8 *extraout_RDX;
  undefined8 *extraout_RDX_00;
  undefined8 unaff_RBX;
  int iVar4;
  code *pcVar5;
  uv_udp_t *puVar6;
  char *pcVar7;
  uv_udp_send_t *puVar8;
  uv_udp_send_t *puVar9;
  int in_R8D;
  bool bVar10;
  sockaddr_in addr;
  undefined1 auStack_a0 [16];
  undefined1 auStack_90 [16];
  code *pcStack_80;
  undefined1 auStack_78 [64];
  code *pcStack_38;
  code *pcStack_30;
  
  pcVar7 = "0.0.0.0";
  pcVar5 = (code *)0x23a3;
  pcStack_30 = (code *)0x188c1d;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&stack0xffffffffffffffe0);
  if (iVar1 == 0) {
    pcStack_30 = (code *)0x188c2a;
    puVar2 = (uv_udp_send_t *)uv_default_loop();
    puVar6 = &server;
    pcStack_30 = (code *)0x188c39;
    iVar1 = uv_udp_init();
    pcVar5 = (code *)puVar6;
    if (iVar1 != 0) goto LAB_00188d88;
    pcStack_30 = (code *)0x188c46;
    puVar2 = (uv_udp_send_t *)uv_default_loop();
    puVar6 = &client;
    pcStack_30 = (code *)0x188c55;
    iVar1 = uv_udp_init();
    pcVar5 = (code *)puVar6;
    if (iVar1 != 0) goto LAB_00188d8d;
    puVar6 = &server;
    pcVar5 = (code *)&stack0xffffffffffffffe0;
    pcStack_30 = (code *)0x188c70;
    iVar1 = uv_udp_bind(&server,pcVar5,0);
    puVar2 = (uv_udp_send_t *)puVar6;
    if (iVar1 != 0) goto LAB_00188d92;
    puVar6 = &server;
    pcVar7 = "239.255.0.1";
    pcStack_30 = (code *)0x188c92;
    iVar1 = uv_udp_set_membership(&server,"239.255.0.1",0,1);
    if (iVar1 != 0) {
      pcVar5 = (code *)pcVar7;
      puVar2 = (uv_udp_send_t *)puVar6;
      if (iVar1 == -0x13) {
        pcStack_30 = (code *)0x188d7c;
        run_test_udp_multicast_join_cold_14();
        return 1;
      }
      goto LAB_00188d97;
    }
    puVar6 = &server;
    pcVar5 = alloc_cb;
    pcStack_30 = (code *)0x188cb4;
    iVar1 = uv_udp_recv_start(&server,alloc_cb,cl_recv_cb);
    puVar2 = (uv_udp_send_t *)puVar6;
    if (iVar1 != 0) goto LAB_00188d9c;
    puVar2 = &req;
    pcStack_30 = (code *)0x188cc8;
    iVar1 = do_send(&req);
    if (iVar1 != 0) goto LAB_00188da1;
    if (close_cb_called != 0) goto LAB_00188da6;
    if (cl_recv_cb_called != 0) goto LAB_00188dab;
    if (sv_send_cb_called != 0) goto LAB_00188db0;
    pcStack_30 = (code *)0x188cfc;
    puVar2 = (uv_udp_send_t *)uv_default_loop();
    pcVar5 = (code *)0x0;
    pcStack_30 = (code *)0x188d06;
    uv_run();
    if (cl_recv_cb_called != 2) goto LAB_00188db5;
    if (sv_send_cb_called != 2) goto LAB_00188dba;
    if (close_cb_called != 2) goto LAB_00188dbf;
    pcStack_30 = (code *)0x188d32;
    uVar3 = uv_default_loop();
    unaff_RBX = 0;
    pcStack_30 = (code *)0x188d48;
    uv_walk(uVar3,close_walk_cb,0);
    pcVar5 = (code *)0x0;
    pcStack_30 = (code *)0x188d52;
    uv_run(uVar3);
    pcStack_30 = (code *)0x188d57;
    puVar2 = (uv_udp_send_t *)uv_default_loop();
    pcStack_30 = (code *)0x188d5f;
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      pcStack_30 = (code *)0x188d68;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_30 = (code *)0x188d88;
    run_test_udp_multicast_join_cold_1();
    puVar2 = (uv_udp_send_t *)pcVar7;
LAB_00188d88:
    pcStack_30 = (code *)0x188d8d;
    run_test_udp_multicast_join_cold_2();
LAB_00188d8d:
    pcStack_30 = (code *)0x188d92;
    run_test_udp_multicast_join_cold_3();
LAB_00188d92:
    pcStack_30 = (code *)0x188d97;
    run_test_udp_multicast_join_cold_4();
LAB_00188d97:
    pcStack_30 = (code *)0x188d9c;
    run_test_udp_multicast_join_cold_15();
LAB_00188d9c:
    pcStack_30 = (code *)0x188da1;
    run_test_udp_multicast_join_cold_5();
LAB_00188da1:
    pcStack_30 = (code *)0x188da6;
    run_test_udp_multicast_join_cold_6();
LAB_00188da6:
    pcStack_30 = (code *)0x188dab;
    run_test_udp_multicast_join_cold_7();
LAB_00188dab:
    pcStack_30 = (code *)0x188db0;
    run_test_udp_multicast_join_cold_8();
LAB_00188db0:
    pcStack_30 = (code *)0x188db5;
    run_test_udp_multicast_join_cold_9();
LAB_00188db5:
    pcStack_30 = (code *)0x188dba;
    run_test_udp_multicast_join_cold_10();
LAB_00188dba:
    pcStack_30 = (code *)0x188dbf;
    run_test_udp_multicast_join_cold_11();
LAB_00188dbf:
    pcStack_30 = (code *)0x188dc4;
    run_test_udp_multicast_join_cold_12();
  }
  pcStack_30 = alloc_cb;
  run_test_udp_multicast_join_cold_13();
  puVar9 = (uv_udp_send_t *)
           CONCAT71(0x55f2,puVar2 == (uv_udp_send_t *)&client || puVar2 == (uv_udp_send_t *)&server)
  ;
  if (puVar2 == (uv_udp_send_t *)&client || puVar2 == (uv_udp_send_t *)&server) {
    if (pcVar5 < (uv_udp_t *)0x10001) {
      *extraout_RDX = alloc_cb::slab;
      extraout_RDX[1] = 0x10000;
      return extraout_EAX;
    }
  }
  else {
    pcStack_38 = (code *)0x188e0a;
    alloc_cb_cold_1();
  }
  pcStack_38 = cl_recv_cb;
  alloc_cb_cold_2();
  bVar10 = puVar2 == (uv_udp_send_t *)&server;
  puVar8 = (uv_udp_send_t *)(ulong)(puVar2 == (uv_udp_send_t *)&client || bVar10);
  if (puVar2 == (uv_udp_send_t *)&client || bVar10) {
    if (in_R8D != 0) goto LAB_00188f0f;
    if ((long)pcVar5 < 0) goto LAB_00188f14;
    if ((uv_udp_t *)pcVar5 != (uv_udp_t *)0x0) {
      if (puVar9 == (uv_udp_send_t *)0x0) goto LAB_00188f19;
      if ((uv_udp_t *)pcVar5 != (uv_udp_t *)0x4) goto LAB_00188f1e;
      if (*(int *)*extraout_RDX_00 == 0x474e4950) {
        cl_recv_cb_called = cl_recv_cb_called + 1;
        if (cl_recv_cb_called == 2) {
          iVar1 = uv_close(&server,close_cb);
          return iVar1;
        }
        goto LAB_00188ea4;
      }
      goto LAB_00188f23;
    }
    if (puVar9 == (uv_udp_send_t *)0x0) {
      return (int)CONCAT71(0x55f1,bVar10);
    }
    pcStack_80 = (code *)0x188ea4;
    cl_recv_cb_cold_10();
LAB_00188ea4:
    pcStack_80 = (code *)0x188eb4;
    iVar1 = uv_ip4_name(puVar9,auStack_78,0x40);
    if (iVar1 != 0) goto LAB_00188f28;
    puVar6 = &server;
    pcStack_80 = (code *)0x188ecf;
    iVar1 = uv_udp_set_membership(&server,"239.255.0.1",0,0);
    puVar9 = (uv_udp_send_t *)puVar6;
    if (iVar1 != 0) goto LAB_00188f2d;
    puVar6 = &server;
    pcStack_80 = (code *)0x188ef1;
    iVar1 = uv_udp_set_source_membership(&server,"239.255.0.1",0,auStack_78,1);
    puVar9 = (uv_udp_send_t *)puVar6;
    if (iVar1 != 0) goto LAB_00188f32;
    puVar9 = &req_ss;
    pcStack_80 = (code *)0x188f01;
    iVar1 = do_send(&req_ss);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    pcStack_80 = (code *)0x188f0f;
    cl_recv_cb_cold_1();
LAB_00188f0f:
    pcStack_80 = (code *)0x188f14;
    cl_recv_cb_cold_2();
LAB_00188f14:
    pcStack_80 = (code *)0x188f19;
    cl_recv_cb_cold_11();
LAB_00188f19:
    pcStack_80 = (code *)0x188f1e;
    cl_recv_cb_cold_9();
LAB_00188f1e:
    pcStack_80 = (code *)0x188f23;
    cl_recv_cb_cold_3();
LAB_00188f23:
    puVar9 = puVar8;
    pcStack_80 = (code *)0x188f28;
    cl_recv_cb_cold_4();
LAB_00188f28:
    pcStack_80 = (code *)0x188f2d;
    cl_recv_cb_cold_5();
LAB_00188f2d:
    pcStack_80 = (code *)0x188f32;
    cl_recv_cb_cold_6();
LAB_00188f32:
    pcStack_80 = (code *)0x188f37;
    cl_recv_cb_cold_7();
  }
  pcStack_80 = do_send;
  cl_recv_cb_cold_8();
  pcStack_80 = (code *)unaff_RBX;
  auStack_a0 = uv_buf_init("PING",4);
  pcVar7 = "239.255.0.1";
  iVar4 = 0x23a3;
  iVar1 = uv_ip4_addr("239.255.0.1",0x23a3,auStack_90);
  if (iVar1 == 0) {
    iVar1 = uv_udp_send(puVar9,&client,auStack_a0,1,auStack_90,sv_send_cb);
    return iVar1;
  }
  do_send_cold_1();
  if ((uv_udp_t *)pcVar7 == &client || (uv_udp_t *)pcVar7 == &server) {
    close_cb_called = close_cb_called + 1;
    return (int)CONCAT71(0x55f1,(uv_udp_t *)pcVar7 == &server);
  }
  close_cb_cold_1();
  if ((uv_udp_t *)pcVar7 == (uv_udp_t *)0x0) {
    sv_send_cb_cold_3();
  }
  else if (iVar4 == 0) {
    pcVar7 = (char *)(((uv_udp_t *)pcVar7)->u).reserved[2];
    if ((uv_udp_t *)pcVar7 == &client || (uv_udp_t *)pcVar7 == &server) {
      sv_send_cb_called = sv_send_cb_called + 1;
      if (sv_send_cb_called != 2) {
        return extraout_EAX_00;
      }
      iVar1 = uv_close(pcVar7,close_cb);
      return iVar1;
    }
    goto LAB_00189029;
  }
  sv_send_cb_cold_1();
LAB_00189029:
  sv_send_cb_cold_2();
  iVar1 = uv_is_closing();
  if (iVar1 == 0) {
    iVar1 = uv_close(pcVar7,0);
    return iVar1;
  }
  return iVar1;
}

Assistant:

TEST_IMPL(udp_multicast_join) {
  int r;
  struct sockaddr_in addr;

  ASSERT(0 == uv_ip4_addr("0.0.0.0", TEST_PORT, &addr));

  r = uv_udp_init(uv_default_loop(), &server);
  ASSERT(r == 0);

  r = uv_udp_init(uv_default_loop(), &client);
  ASSERT(r == 0);

  /* bind to the desired port */
  r = uv_udp_bind(&server, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);

  /* join the multicast channel */
  r = uv_udp_set_membership(&server, MULTICAST_ADDR, NULL, UV_JOIN_GROUP);
  if (r == UV_ENODEV)
    RETURN_SKIP("No multicast support.");
  ASSERT(r == 0);

  r = uv_udp_recv_start(&server, alloc_cb, cl_recv_cb);
  ASSERT(r == 0);

  r = do_send(&req);
  ASSERT(r == 0);

  ASSERT(close_cb_called == 0);
  ASSERT(cl_recv_cb_called == 0);
  ASSERT(sv_send_cb_called == 0);

  /* run the loop till all events are processed */
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(cl_recv_cb_called == 2);
  ASSERT(sv_send_cb_called == 2);
  ASSERT(close_cb_called == 2);

  MAKE_VALGRIND_HAPPY();
  return 0;
}